

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::visitCall(WasmBinaryBuilder *this,Call *curr)

{
  bool bVar1;
  Expression *pEVar2;
  Expression **ppEVar3;
  mapped_type *this_00;
  Name *local_48;
  ulong local_40;
  size_t i;
  size_t num;
  Signature sig;
  uint32_t index;
  Call *curr_local;
  WasmBinaryBuilder *this_local;
  
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"zz node: Call\n");
  }
  sig.results.id._4_4_ = getU32LEB(this);
  _num = getSignatureByFunctionIndex(this,sig.results.id._4_4_);
  i = wasm::Type::size((Type *)&num);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            (&(curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,i);
  for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
    pEVar2 = popNonVoidExpression(this);
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(i - local_40) - 1);
    *ppEVar3 = pEVar2;
  }
  (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = sig.params.id
  ;
  this_00 = std::
            map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
            ::operator[](&this->functionRefs,(key_type *)((long)&sig.results.id + 4));
  local_48 = &curr->target;
  std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>::push_back(this_00,&local_48);
  Call::finalize(curr);
  return;
}

Assistant:

void WasmBinaryBuilder::visitCall(Call* curr) {
  BYN_TRACE("zz node: Call\n");
  auto index = getU32LEB();
  auto sig = getSignatureByFunctionIndex(index);
  auto num = sig.params.size();
  curr->operands.resize(num);
  for (size_t i = 0; i < num; i++) {
    curr->operands[num - i - 1] = popNonVoidExpression();
  }
  curr->type = sig.results;
  // We don't know function names yet.
  functionRefs[index].push_back(&curr->target);
  curr->finalize();
}